

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_isolat1ToUTF8(void)

{
  int iVar1;
  int iVar2;
  uchar *val;
  int *val_00;
  uchar *val_01;
  int *val_02;
  int local_54;
  int n_inlen;
  int *inlen;
  int n_in;
  uchar *in;
  int n_outlen;
  int *outlen;
  int n_out;
  uchar *out;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (outlen._4_4_ = 0; (int)outlen._4_4_ < 1; outlen._4_4_ = outlen._4_4_ + 1) {
    for (in._4_4_ = 0; (int)in._4_4_ < 2; in._4_4_ = in._4_4_ + 1) {
      for (inlen._4_4_ = 0; (int)inlen._4_4_ < 1; inlen._4_4_ = inlen._4_4_ + 1) {
        for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_unsigned_char_ptr(outlen._4_4_,0);
          val_00 = gen_int_ptr(in._4_4_,1);
          val_01 = gen_const_unsigned_char_ptr(inlen._4_4_,2);
          val_02 = gen_int_ptr(local_54,3);
          iVar2 = isolat1ToUTF8(val,val_00,val_01,val_02);
          desret_int(iVar2);
          call_tests = call_tests + 1;
          des_unsigned_char_ptr(outlen._4_4_,val,0);
          des_int_ptr(in._4_4_,val_00,1);
          des_const_unsigned_char_ptr(inlen._4_4_,val_01,2);
          des_int_ptr(local_54,val_02,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in isolat1ToUTF8",(ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)outlen._4_4_);
            printf(" %d",(ulong)in._4_4_);
            printf(" %d",(ulong)inlen._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_isolat1ToUTF8(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    unsigned char * out; /* a pointer to an array of bytes to store the result */
    int n_out;
    int * outlen; /* the length of @out */
    int n_outlen;
    unsigned char * in; /* a pointer to an array of ISO Latin 1 chars */
    int n_in;
    int * inlen; /* the length of @in */
    int n_inlen;

    for (n_out = 0;n_out < gen_nb_unsigned_char_ptr;n_out++) {
    for (n_outlen = 0;n_outlen < gen_nb_int_ptr;n_outlen++) {
    for (n_in = 0;n_in < gen_nb_const_unsigned_char_ptr;n_in++) {
    for (n_inlen = 0;n_inlen < gen_nb_int_ptr;n_inlen++) {
        mem_base = xmlMemBlocks();
        out = gen_unsigned_char_ptr(n_out, 0);
        outlen = gen_int_ptr(n_outlen, 1);
        in = gen_const_unsigned_char_ptr(n_in, 2);
        inlen = gen_int_ptr(n_inlen, 3);

        ret_val = isolat1ToUTF8(out, outlen, (const unsigned char *)in, inlen);
        desret_int(ret_val);
        call_tests++;
        des_unsigned_char_ptr(n_out, out, 0);
        des_int_ptr(n_outlen, outlen, 1);
        des_const_unsigned_char_ptr(n_in, (const unsigned char *)in, 2);
        des_int_ptr(n_inlen, inlen, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in isolat1ToUTF8",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_out);
            printf(" %d", n_outlen);
            printf(" %d", n_in);
            printf(" %d", n_inlen);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}